

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::InsertRuleLauncher
          (cmLocalGenerator *this,string *s,cmGeneratorTarget *target,string *prop)

{
  char *__s;
  size_t sVar1;
  ostringstream wrapped;
  long *local_1b0 [2];
  long local_1a0 [2];
  undefined1 local_190 [376];
  
  __s = GetRuleLauncher(this,target,prop);
  if (__s != (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,__s,sVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,(s->_M_dataplus)._M_p,s->_M_string_length);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)s,(string *)local_1b0);
    if (local_1b0[0] != local_1a0) {
      operator_delete(local_1b0[0],local_1a0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
    std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  }
  return;
}

Assistant:

void cmLocalGenerator::InsertRuleLauncher(std::string& s,
                                          cmGeneratorTarget* target,
                                          const std::string& prop)
{
  if(const char* val = this->GetRuleLauncher(target, prop))
    {
    std::ostringstream wrapped;
    wrapped << val << " " << s;
    s = wrapped.str();
    }
}